

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::convert_row_major_matrix
          (CompilerGLSL *this,string *exp_str,SPIRType *exp_type,uint32_t param_3,bool param_4)

{
  bool bVar1;
  long lVar2;
  undefined4 in_register_0000000c;
  SPIRType *type;
  char local_b2 [2];
  spirv_cross local_b0 [36];
  uint local_8c;
  undefined1 local_88 [4];
  uint32_t c;
  undefined1 local_65;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> column_expr;
  size_type column_index;
  bool param_4_local;
  uint32_t param_3_local;
  SPIRType *exp_type_local;
  string *exp_str_local;
  CompilerGLSL *this_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *transposed_expr;
  
  type = (SPIRType *)CONCAT44(in_register_0000000c,param_3);
  strip_enclosed_expression((CompilerGLSL *)exp_str,(string *)exp_type);
  bVar1 = Compiler::is_matrix((Compiler *)exp_str,type);
  if (bVar1) {
    join<char_const(&)[11],std::__cxx11::string&,char_const(&)[2]>
              ((spirv_cross *)this,(char (*) [11])0x4e9719,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)exp_type,
               (char (*) [2])0x4dff7a);
  }
  else {
    lVar2 = ::std::__cxx11::string::find_last_of((char)exp_type,0x5b);
    if (lVar2 == -1) {
      ::std::__cxx11::string::string((string *)this,(string *)exp_type);
    }
    else {
      ::std::__cxx11::string::substr((ulong)local_58,(ulong)exp_type);
      ::std::__cxx11::string::resize((ulong)exp_type);
      local_65 = 0;
      type_to_glsl_constructor_abi_cxx11_((CompilerGLSL *)local_88,(SPIRType *)exp_str);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       local_88);
      ::std::__cxx11::string::~string((string *)local_88);
      for (local_8c = 0; local_8c < type->vecsize; local_8c = local_8c + 1) {
        local_b2[1] = 0x5b;
        local_b2[0] = ']';
        join<std::__cxx11::string&,char,unsigned_int&,char,std::__cxx11::string&>
                  (local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            exp_type,local_b2 + 1,&local_8c,local_b2,local_58);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_b0);
        ::std::__cxx11::string::~string((string *)local_b0);
        if (local_8c + 1 < type->vecsize) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
      ::std::__cxx11::string::operator+=((string *)this,")");
      local_65 = 1;
      ::std::__cxx11::string::~string((string *)local_58);
    }
  }
  return this;
}

Assistant:

string CompilerGLSL::convert_row_major_matrix(string exp_str, const SPIRType &exp_type, uint32_t /* physical_type_id */,
                                              bool /*is_packed*/)
{
	strip_enclosed_expression(exp_str);
	if (!is_matrix(exp_type))
	{
		auto column_index = exp_str.find_last_of('[');
		if (column_index == string::npos)
			return exp_str;

		auto column_expr = exp_str.substr(column_index);
		exp_str.resize(column_index);

		auto transposed_expr = type_to_glsl_constructor(exp_type) + "(";

		// Loading a column from a row-major matrix. Unroll the load.
		for (uint32_t c = 0; c < exp_type.vecsize; c++)
		{
			transposed_expr += join(exp_str, '[', c, ']', column_expr);
			if (c + 1 < exp_type.vecsize)
				transposed_expr += ", ";
		}

		transposed_expr += ")";
		return transposed_expr;
	}
	else
		return join("transpose(", exp_str, ")");
}